

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_io.hpp
# Opt level: O0

pair<async_simple::coro::Lazy<std::pair<std::error_code,_int>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qicosmos[P]cinatra_tests_test_cinatra_cpp:1100:33)>
* coro_io::
  select_impl<std::pair<async_simple::coro::Lazy<std::pair<std::error_code,int>>,test_select_channel()::__0>>
            (pair<async_simple::coro::Lazy<std::pair<std::error_code,_int>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qicosmos[P]cinatra_tests_test_cinatra_cpp:1100:33)>
             *pair)

{
  pair<async_simple::coro::Lazy<std::pair<std::error_code,_int>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qicosmos[P]cinatra_tests_test_cinatra_cpp:1100:33)>
  *in_RDI;
  type *callback;
  
  std::get<1ul,async_simple::coro::Lazy<std::pair<std::error_code,int>>,test_select_channel()::__0>
            ((pair<async_simple::coro::Lazy<std::pair<std::error_code,_int>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qicosmos[P]cinatra_tests_test_cinatra_cpp:1100:33)>
              *)0x4f6953);
  return in_RDI;
}

Assistant:

inline decltype(auto) select_impl(T &pair) {
  using Func = std::tuple_element_t<1, std::remove_cvref_t<T>>;
  using ValueType =
      typename std::tuple_element_t<0, std::remove_cvref_t<T>>::ValueType;
  using return_type = std::invoke_result_t<Func, async_simple::Try<ValueType>>;

  auto &callback = std::get<1>(pair);
  if constexpr (coro_io::is_lazy_v<return_type>) {
    auto executor = std::get<0>(pair).getExecutor();
    return std::make_pair(
        std::move(std::get<0>(pair)),
        [executor, callback = std::move(callback)](auto &&val) {
          if (executor) {
            callback(std::move(val)).via(executor).start([](auto &&) {
            });
          }
          else {
            callback(std::move(val)).start([](auto &&) {
            });
          }
        });
  }
  else {
    return pair;
  }
}